

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall chaiscript::AST_Node::~AST_Node(AST_Node *this)

{
  AST_Node *this_local;
  
  this->_vptr_AST_Node = (_func_int **)&PTR___cxa_pure_virtual_00877088;
  Parse_Location::~Parse_Location(&this->location);
  std::__cxx11::string::~string((string *)&this->text);
  return;
}

Assistant:

virtual ~AST_Node() noexcept = default;